

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

double __thiscall
soplex::SPxScaler<double>::getRowMinAbsUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  int iVar1;
  DataArray<int> *pDVar2;
  DataArray<int> *pDVar3;
  Nonzero<double> *pNVar4;
  double *pdVar5;
  Item *pIVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  Real RVar11;
  ulong extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double local_88;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  double local_48;
  ulong uStack_40;
  
  pDVar2 = this->m_activeColscaleExp;
  pDVar3 = this->m_activeRowscaleExp;
  pIVar6 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
           (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  pdVar5 = (double *)infinity();
  local_88 = *pdVar5;
  iVar1 = pDVar3->data[i];
  lVar7 = 8;
  for (lVar8 = 0; lVar8 < (pIVar6->data).super_SVectorBase<double>.memused; lVar8 = lVar8 + 1) {
    pNVar4 = (pIVar6->data).super_SVectorBase<double>.m_elem;
    dVar10 = ldexp(*(double *)((long)pNVar4 + lVar7 + -8),
                   -(pDVar2->data[*(int *)((long)&pNVar4->val + lVar7)] + iVar1));
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar11 = Tolerances::epsilon(local_68._M_ptr);
    uStack_40 = extraout_XMM0_Qb & 0x7fffffffffffffff;
    local_48 = ABS(dVar10) - local_88;
    local_58 = SUB84(RVar11,0);
    uStack_54 = (uint)((ulong)RVar11 >> 0x20) ^ 0x80000000;
    uStack_50 = (undefined4)extraout_XMM0_Qb_00;
    uStack_4c = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20) ^ 0x80000000;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    uVar9 = -(ulong)(local_48 < (double)CONCAT44(uStack_54,local_58));
    local_88 = (double)(~uVar9 & (ulong)local_88 | (ulong)ABS(dVar10) & uVar9);
    lVar7 = lVar7 + 0x10;
  }
  return local_88;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}